

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  DistConstraintListSyntax *pDVar1;
  Token *unaff_retaddr;
  Token *in_stack_00000008;
  BumpAllocator *in_stack_00000010;
  BumpAllocator *in_stack_000000f8;
  SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax> *in_stack_00000100;
  
  parsing::Token::deepClone((Token *)in_stack_00000100,in_stack_000000f8);
  parsing::Token::deepClone((Token *)in_stack_00000100,in_stack_000000f8);
  deepClone<slang::syntax::DistItemBaseSyntax>(in_stack_00000100,in_stack_000000f8);
  parsing::Token::deepClone((Token *)in_stack_00000100,in_stack_000000f8);
  pDVar1 = BumpAllocator::
           emplace<slang::syntax::DistConstraintListSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax>&,slang::parsing::Token>
                     (in_stack_00000010,in_stack_00000008,unaff_retaddr,
                      (SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax> *)__fn,
                      (Token *)__child_stack);
  return (int)pDVar1;
}

Assistant:

static SyntaxNode* clone(const DistConstraintListSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<DistConstraintListSyntax>(
        node.dist.deepClone(alloc),
        node.openBrace.deepClone(alloc),
        *deepClone(node.items, alloc),
        node.closeBrace.deepClone(alloc)
    );
}